

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xmlwrite_time(archive_write *a,xml_writer *writer,char *key,time_t t,int z)

{
  int iVar1;
  undefined1 local_d0 [8];
  tm tm;
  char timestr [100];
  time_t tStack_28;
  int z_local;
  time_t t_local;
  char *key_local;
  xml_writer *writer_local;
  archive_write *a_local;
  
  tStack_28 = t;
  t_local = (time_t)key;
  key_local = (char *)writer;
  writer_local = (xml_writer *)a;
  gmtime_r(&stack0xffffffffffffffd8,(tm *)local_d0);
  memset(&tm.tm_zone,0,100);
  strftime((char *)&tm.tm_zone,100,"%Y-%m-%dT%H:%M:%S",(tm *)local_d0);
  if (z != 0) {
    strcat((char *)&tm.tm_zone,"Z");
  }
  iVar1 = xmlwrite_string((archive_write *)writer_local,(xml_writer *)key_local,(char *)t_local,
                          (char *)&tm.tm_zone);
  return iVar1;
}

Assistant:

static int
xmlwrite_time(struct archive_write *a, struct xml_writer *writer,
	const char *key, time_t t, int z)
{
	char timestr[100];
	struct tm tm;

#if defined(HAVE_GMTIME_S)
	gmtime_s(&tm, &t);
#elif defined(HAVE_GMTIME_R)
	gmtime_r(&t, &tm);
#else
	memcpy(&tm, gmtime(&t), sizeof(tm));
#endif
	memset(&timestr, 0, sizeof(timestr));
	/* Do not use %F and %T for portability. */
	strftime(timestr, sizeof(timestr), "%Y-%m-%dT%H:%M:%S", &tm);
	if (z)
		strcat(timestr, "Z");
	return (xmlwrite_string(a, writer, key, timestr));
}